

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O3

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  long lVar7;
  longlong lVar8;
  size_t sVar9;
  undefined1 auVar10 [8];
  long lVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  HSQUIRRELVM v_00;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  char *local_a8;
  long local_a0;
  size_t local_98;
  HSQUIRRELVM local_90;
  SQFloat local_84;
  SQInteger local_80;
  long local_78;
  undefined1 local_70 [8];
  char local_68;
  undefined1 local_67 [23];
  SQChar *local_50;
  SQInteger *local_48;
  SQChar **local_40;
  long local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,&local_50);
  if (-1 < SVar4) {
    local_48 = outlen;
    local_40 = output;
    SVar5 = sq_getsize(v,nformatstringidx);
    local_90 = v;
    pSVar6 = sq_getscratchpad(v,SVar5 + 2U);
    if (0 < SVar5) {
      lVar11 = nformatstringidx + 1;
      lVar15 = 0;
      lVar16 = 0;
      local_a0 = 0;
      local_98 = SVar5 + 2U;
      local_80 = SVar5;
LAB_0017070d:
      v_00 = local_90;
      if (local_50[lVar16] == '%') {
        if (local_50[lVar16 + 1] == '%') {
          pSVar6[lVar15] = '%';
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 2;
          goto LAB_00170a22;
        }
        SVar5 = sq_gettop(local_90);
        pSVar6 = local_50;
        if (SVar5 < lVar11) {
          pcVar14 = "not enough parameters for the given format string";
          goto LAB_00170ac9;
        }
        lVar13 = lVar16 + 1;
        local_68 = '%';
        pcVar14 = local_50 + lVar16 + 2;
        lVar16 = lVar16 + 2;
        lVar12 = lVar13;
        while (((ulong)(byte)local_50[lVar12] < 0x31 &&
               ((0x1280900000000U >> ((ulong)(byte)local_50[lVar12] & 0x3f) & 1) != 0))) {
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + 1;
          pcVar14 = pcVar14 + 1;
        }
        lVar7 = 0;
        do {
          local_78 = lVar11;
          if (9 < (int)local_50[lVar12] - 0x30U) {
            *(undefined1 *)((long)&local_a8 + lVar7) = 0;
            if (lVar7 == 0) {
              local_a0 = 0;
            }
            else {
              local_38 = lVar13;
              local_a0 = strtoll((char *)&local_a8,(char **)local_70,10);
              lVar13 = local_38;
            }
            lVar11 = local_78;
            v_00 = local_90;
            if (pSVar6[lVar12] != '.') goto LAB_00170875;
            lVar7 = 0;
            goto LAB_00170812;
          }
          *(SQChar *)((long)&local_a8 + lVar7) = local_50[lVar12];
          lVar12 = lVar12 + 1;
          lVar7 = lVar7 + 1;
          lVar16 = lVar16 + 1;
          pcVar14 = pcVar14 + 1;
        } while (lVar7 != 3);
        pcVar14 = "width format too long";
LAB_00170893:
        v_00 = local_90;
        lVar12 = sq_throwerror(local_90,pcVar14);
        lVar11 = local_78;
        goto LAB_001708c3;
      }
      pSVar6[lVar15] = local_50[lVar16];
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 1;
      goto LAB_00170a22;
    }
    lVar15 = 0;
LAB_00170a81:
    *local_48 = lVar15;
    pSVar6[lVar15] = '\0';
    *local_40 = pSVar6;
    SVar4 = 0;
  }
  return SVar4;
LAB_00170812:
  if ((int)*pcVar14 - 0x30U < 10) goto code_r0x0017081f;
  *(undefined1 *)((long)&local_a8 + lVar7) = 0;
  lVar12 = lVar16;
  if (lVar7 != 0) {
    lVar8 = strtoll((char *)&local_a8,(char **)local_70,10);
    local_a0 = local_a0 + lVar8;
  }
LAB_00170875:
  v_00 = local_90;
  lVar11 = lVar12 - lVar13;
  if (0x14 < lVar11) {
    pcVar14 = "format too long";
    goto LAB_00170893;
  }
  memcpy(local_67,pSVar6 + lVar13,lVar11 + 1);
  local_67[lVar11 + 1] = 0;
  lVar11 = local_78;
  goto LAB_001708c3;
code_r0x0017081f:
  *(char *)((long)&local_a8 + lVar7) = *pcVar14;
  lVar7 = lVar7 + 1;
  lVar16 = lVar16 + 1;
  pcVar14 = pcVar14 + 1;
  if (lVar7 == 3) goto code_r0x00170831;
  goto LAB_00170812;
code_r0x00170831:
  lVar12 = sq_throwerror(local_90,"precision format too long");
LAB_001708c3:
  if (lVar12 < 0) {
    return -1;
  }
  local_70 = (undefined1  [8])0x0;
  local_a8 = (char *)0x0;
  local_84 = 0.0;
  bVar1 = local_50[lVar12];
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) {
switchD_0017090c_caseD_65:
      SVar4 = sq_getfloat(v_00,lVar11,&local_84);
      if (-1 < SVar4) {
        sVar9 = local_98 + local_a0 + 0x66;
        pSVar6 = sq_getscratchpad(v_00,sVar9);
        local_98 = sVar9;
        iVar3 = snprintf(pSVar6 + lVar15,sVar9,&local_68,(double)local_84);
        if (0 < iVar3) {
          iVar3 = iVar3 + 1;
          do {
            if (pSVar6[lVar15] == ',') {
              pSVar6[lVar15] = '.';
            }
            lVar15 = lVar15 + 1;
            iVar3 = iVar3 + -1;
          } while (1 < iVar3);
        }
        goto LAB_00170a1c;
      }
      pcVar14 = "float expected for the specified format";
      goto LAB_00170ac9;
    }
    if (bVar1 != 0x58) goto switchD_0017090c_caseD_68;
switchD_0017090c_caseD_64:
    sVar9 = strlen(&local_68);
    uVar2 = local_70[sVar9 + 7];
    *(undefined2 *)(local_70 + sVar9 + 7) = 0x6c6c;
    local_67[sVar9] = uVar2;
    local_67[sVar9 + 1] = 0;
    goto switchD_0017090c_caseD_63;
  }
  switch(bVar1) {
  case 99:
switchD_0017090c_caseD_63:
    SVar4 = sq_getinteger(v_00,lVar11,(SQInteger *)&local_a8);
    if (SVar4 < 0) {
      pcVar14 = "integer expected for the specified format";
LAB_00170ac9:
      SVar4 = sq_throwerror(v_00,pcVar14);
      return SVar4;
    }
    sVar9 = local_98 + local_a0 + 0x66;
    pSVar6 = sq_getscratchpad(v_00,sVar9);
    auVar10 = (undefined1  [8])local_a8;
    break;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_0017090c_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_0017090c_caseD_65;
  default:
switchD_0017090c_caseD_68:
    pcVar14 = "invalid format";
    goto LAB_00170ac9;
  case 0x73:
    SVar4 = sq_getstring(v_00,lVar11,(SQChar **)local_70);
    if (SVar4 < 0) {
      pcVar14 = "string expected for the specified format";
      goto LAB_00170ac9;
    }
    SVar5 = sq_getsize(v_00,lVar11);
    sVar9 = local_98 + local_a0 + SVar5 + 2;
    pSVar6 = sq_getscratchpad(v_00,sVar9);
    auVar10 = local_70;
  }
  local_98 = sVar9;
  iVar3 = snprintf(pSVar6 + lVar15,sVar9,&local_68,auVar10);
  lVar15 = lVar15 + iVar3;
LAB_00170a1c:
  lVar16 = lVar12 + 1;
  lVar11 = lVar11 + 1;
  SVar5 = local_80;
LAB_00170a22:
  if (SVar5 <= lVar16) goto LAB_00170a81;
  goto LAB_0017070d;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = strlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': {
                int len = scsprintf(&dest[i], allocated, fmt, tf);
                for (; len > 0; len--, i++)
                    if (dest[i] == ',')
                        dest[i] = '.';
                break;
                }
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}